

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_writer.cpp
# Opt level: O2

ImageWriter * dpfb::ImageWriter::get(char *name)

{
  ImageWriter *pIVar1;
  ImageWriterError *this;
  string sStack_38;
  
  pIVar1 = findPlugin<dpfb::ImageWriter>(name);
  if (pIVar1 != (ImageWriter *)0x0) {
    return pIVar1;
  }
  this = (ImageWriterError *)__cxa_allocate_exception(0x10);
  str::format_abi_cxx11_(&sStack_38,"No such image writer: \"%s\"",name);
  ImageWriterError::runtime_error(this,&sStack_38);
  __cxa_throw(this,&ImageWriterError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const ImageWriter& ImageWriter::get(const char* name)
{
    if (const auto* writer = find(name))
        return *writer;

    throw ImageWriterError(
        str::format("No such image writer: \"%s\"", name));
}